

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_avx2.c
# Opt level: O0

void quantize(__m256i *qp,__m256i *c,int16_t *iscan_ptr,int log_scale,tran_low_t *qcoeff,
             tran_low_t *dqcoeff,__m256i *eob)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  uint in_ECX;
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined1 (*in_stack_00000008) [32];
  __m256i nz;
  __m256i zc;
  __m256i zero;
  __m256i iscan;
  __m128i hi;
  __m128i lo;
  __m128i zr;
  __m128i isc;
  __m256i dq;
  __m256i mask;
  __m256i abs_s;
  __m256i qp_hi;
  __m256i q_hi;
  __m256i q_lo;
  __m256i q;
  __m256i abs_coeff;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  ulong uStack_6b8;
  ulong uStack_678;
  
  auVar3 = vpabsd_avx2(*in_RSI);
  auVar4 = vpaddd_avx2(auVar3,*in_RDI);
  auVar5 = vpmuldq_avx2(auVar4,in_RDI[1]);
  auVar4 = vpsrlq_avx2(auVar4,ZEXT416(0x20));
  auVar6 = vpsrlq_avx2(in_RDI[1],ZEXT416(0x20));
  auVar4 = vpmuldq_avx2(auVar4,auVar6);
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x10 - in_ECX));
  auVar4 = vpsrlq_avx2(auVar4,ZEXT416(0x10 - in_ECX));
  auVar4 = vpsllq_avx2(auVar4,ZEXT416(0x20));
  auVar4 = vpor_avx2(auVar5,auVar4);
  auVar3 = vpslld_avx2(auVar3,ZEXT416(in_ECX + 1));
  auVar3 = vpcmpgtd_avx2(in_RDI[2],auVar3);
  auVar3 = vpandn_avx2(auVar3,auVar4);
  auVar4 = vpmulld_avx2(auVar3,in_RDI[2]);
  auVar4 = vpsrad_avx2(auVar4,ZEXT416(in_ECX));
  auVar3 = vpsignd_avx2(auVar3,*in_RSI);
  auVar4 = vpsignd_avx2(auVar4,*in_RSI);
  local_740 = auVar3._0_8_;
  uStack_738 = auVar3._8_8_;
  uStack_730 = auVar3._16_8_;
  uStack_728 = auVar3._24_8_;
  *in_R8 = local_740;
  in_R8[1] = uStack_738;
  in_R8[2] = uStack_730;
  in_R8[3] = uStack_728;
  local_800 = auVar4._0_8_;
  uStack_7f8 = auVar4._8_8_;
  uStack_7f0 = auVar4._16_8_;
  uStack_7e8 = auVar4._24_8_;
  *in_R9 = local_800;
  in_R9[1] = uStack_7f8;
  in_R9[2] = uStack_7f0;
  in_R9[3] = uStack_7e8;
  uStack_678 = SUB168(ZEXT816(0),4);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uStack_678;
  auVar2 = vpunpcklwd_avx(*in_RDX,auVar1 << 0x40);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uStack_678;
  auVar1 = vpunpckhwd_avx(*in_RDX,auVar7 << 0x40);
  local_840 = auVar1._0_8_;
  uStack_838 = auVar1._8_8_;
  uStack_6b8 = SUB328(ZEXT832(0),4);
  auVar3 = vpcmpeqd_avx2(auVar4,ZEXT832(uStack_6b8) << 0x40);
  auVar3 = vpcmpeqd_avx2(auVar3,ZEXT832(uStack_6b8) << 0x40);
  auVar4._16_8_ = local_840;
  auVar4._0_16_ = auVar2;
  auVar4._24_8_ = uStack_838;
  auVar4 = vpsubd_avx2(auVar4,auVar3);
  auVar3 = vpand_avx2(auVar4,auVar3);
  auVar3 = vpmaxsd_avx2(auVar3,*in_stack_00000008);
  *in_stack_00000008 = auVar3;
  return;
}

Assistant:

static inline void quantize(const __m256i *qp, __m256i *c,
                            const int16_t *iscan_ptr, int log_scale,
                            tran_low_t *qcoeff, tran_low_t *dqcoeff,
                            __m256i *eob) {
  const __m256i abs_coeff = _mm256_abs_epi32(*c);
  __m256i q = _mm256_add_epi32(abs_coeff, qp[0]);

  __m256i q_lo = _mm256_mul_epi32(q, qp[1]);
  __m256i q_hi = _mm256_srli_epi64(q, 32);
  const __m256i qp_hi = _mm256_srli_epi64(qp[1], 32);
  q_hi = _mm256_mul_epi32(q_hi, qp_hi);
  q_lo = _mm256_srli_epi64(q_lo, 16 - log_scale);
  q_hi = _mm256_srli_epi64(q_hi, 16 - log_scale);
  q_hi = _mm256_slli_epi64(q_hi, 32);
  q = _mm256_or_si256(q_lo, q_hi);
  const __m256i abs_s = _mm256_slli_epi32(abs_coeff, 1 + log_scale);
  const __m256i mask = _mm256_cmpgt_epi32(qp[2], abs_s);
  q = _mm256_andnot_si256(mask, q);

  __m256i dq = _mm256_mullo_epi32(q, qp[2]);
  dq = _mm256_srai_epi32(dq, log_scale);
  q = _mm256_sign_epi32(q, *c);
  dq = _mm256_sign_epi32(dq, *c);

  _mm256_storeu_si256((__m256i *)qcoeff, q);
  _mm256_storeu_si256((__m256i *)dqcoeff, dq);

  const __m128i isc = _mm_loadu_si128((const __m128i *)iscan_ptr);
  const __m128i zr = _mm_setzero_si128();
  const __m128i lo = _mm_unpacklo_epi16(isc, zr);
  const __m128i hi = _mm_unpackhi_epi16(isc, zr);
  const __m256i iscan =
      _mm256_insertf128_si256(_mm256_castsi128_si256(lo), hi, 1);

  const __m256i zero = _mm256_setzero_si256();
  const __m256i zc = _mm256_cmpeq_epi32(dq, zero);
  const __m256i nz = _mm256_cmpeq_epi32(zc, zero);
  __m256i cur_eob = _mm256_sub_epi32(iscan, nz);
  cur_eob = _mm256_and_si256(cur_eob, nz);
  *eob = _mm256_max_epi32(cur_eob, *eob);
}